

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O0

void __thiscall cmCMakePath::GetNativePath(cmCMakePath *this,string *path)

{
  string local_70;
  undefined1 local_40 [8];
  path tmp;
  string *path_local;
  cmCMakePath *this_local;
  
  tmp._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )path;
  std::filesystem::__cxx11::path::path((path *)local_40,&this->Path);
  std::filesystem::__cxx11::path::make_preferred((path *)local_40);
  std::filesystem::__cxx11::path::string(&local_70,(path *)local_40);
  std::__cxx11::string::operator=
            ((string *)
             tmp._M_cmpts._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  return;
}

Assistant:

void cmCMakePath::GetNativePath(std::string& path) const
{
  cm::filesystem::path tmp(this->Path);
  tmp.make_preferred();

  path = tmp.string();
}